

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

void __thiscall
draco::Encoder::SetAttributeExplicitQuantization
          (Encoder *this,Type type,int quantization_bits,int num_dims,float *origin,float range)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> *this_00;
  allocator<char> local_49;
  Type local_48;
  float local_44;
  string local_40;
  
  local_48 = type;
  local_44 = range;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"quantization_bits",&local_49);
  this_00 = &(this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
             options_;
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
            (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_48,&local_40,
             quantization_bits);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"quantization_origin",&local_49);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeVector<float>
            (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_48,&local_40,
             num_dims,origin);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"quantization_range",&local_49);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeFloat
            (&this_00->super_DracoOptions<draco::GeometryAttribute::Type>,&local_48,&local_40,
             local_44);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Encoder::SetAttributeExplicitQuantization(GeometryAttribute::Type type,
                                               int quantization_bits,
                                               int num_dims,
                                               const float *origin,
                                               float range) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
  options().SetAttributeVector(type, "quantization_origin", num_dims, origin);
  options().SetAttributeFloat(type, "quantization_range", range);
}